

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproxystyle.cpp
# Opt level: O0

void __thiscall
QProxyStyle::drawItemPixmap
          (QProxyStyle *this,QPainter *painter,QRect *rect,int alignment,QPixmap *pixmap)

{
  QStyle *pQVar1;
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  QProxyStylePrivate *in_RDI;
  undefined8 in_R8;
  QProxyStylePrivate *d;
  
  d_func((QProxyStyle *)0x40908a);
  QProxyStylePrivate::ensureBaseStyle(in_RDI);
  pQVar1 = QPointer<QStyle>::operator->((QPointer<QStyle> *)0x4090aa);
  (**(code **)(*(long *)pQVar1 + 0xa0))(pQVar1,in_RSI,in_RDX,in_ECX,in_R8);
  return;
}

Assistant:

void QProxyStyle::drawItemPixmap(QPainter *painter, const QRect &rect, int alignment, const QPixmap &pixmap) const
{
    Q_D (const QProxyStyle);
    d->ensureBaseStyle();
    d->baseStyle->drawItemPixmap(painter, rect, alignment, pixmap);
}